

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O2

size_t HUF_buildCTable_wksp
                 (HUF_CElt *tree,uint *count,U32 maxSymbolValue,U32 maxNbBits,void *workSpace,
                 size_t wkspSize)

{
  char *pcVar1;
  byte bVar2;
  U16 UVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ushort uVar8;
  int iVar9;
  long lVar10;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  byte bVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  uint uVar26;
  size_t sStack_170;
  U16 valPerRank [13];
  U16 nbPerRank [13];
  
  if (((ulong)workSpace & 3) == 0) {
    if (wkspSize < 0x1000) {
      sStack_170 = 0xffffffffffffffbe;
    }
    else {
      uVar16 = 0xb;
      if (maxNbBits != 0) {
        uVar16 = maxNbBits;
      }
      if (maxSymbolValue < 0x100) {
        memset(workSpace,0,0x1000);
        memset(nbPerRank,0,0x100);
        uVar15 = (ulong)(maxSymbolValue + 1);
        for (uVar24 = 0; uVar15 != uVar24; uVar24 = uVar24 + 1) {
          uVar26 = 0x1f;
          if (count[uVar24] + 1 != 0) {
            for (; count[uVar24] + 1 >> uVar26 == 0; uVar26 = uVar26 - 1) {
            }
          }
          *(int *)(nbPerRank + (ulong)uVar26 * 4) = *(int *)(nbPerRank + (ulong)uVar26 * 4) + 1;
        }
        for (uVar24 = 0x1d; uVar24 != 0xffffffffffffffff; uVar24 = uVar24 - 1) {
          *(int *)(nbPerRank + (uVar24 & 0xffffffff) * 4) =
               *(int *)(nbPerRank + (uVar24 & 0xffffffff) * 4) +
               *(int *)(nbPerRank + uVar24 * 4 + 4);
        }
        for (lVar10 = 0; lVar10 != 0x20; lVar10 = lVar10 + 1) {
          *(undefined4 *)(nbPerRank + lVar10 * 4 + 2) = *(undefined4 *)(nbPerRank + lVar10 * 4);
        }
        for (uVar24 = 0; uVar24 != uVar15; uVar24 = uVar24 + 1) {
          uVar26 = count[uVar24];
          uVar17 = 0x1f;
          if (uVar26 + 1 != 0) {
            for (; uVar26 + 1 >> uVar17 == 0; uVar17 = uVar17 - 1) {
            }
          }
          uVar19 = (ulong)((uVar17 ^ 0x1fffffe0) * 8 + 0x108);
          uVar17 = *(uint *)((long)nbPerRank + uVar19);
          uVar4 = *(uint *)((long)nbPerRank + uVar19 + 4);
          uVar18 = (ulong)uVar4;
          *(uint *)((long)nbPerRank + uVar19 + 4) = uVar4 + 1;
          uVar19 = (ulong)uVar4;
          if (uVar17 < uVar4) {
            uVar19 = (ulong)uVar17;
          }
          for (; uVar17 < uVar18; uVar18 = uVar18 - 1) {
            uVar25 = (ulong)((int)uVar18 - 1);
            if (uVar26 <= *(uint *)((long)workSpace + uVar25 * 8 + 8)) {
              uVar19 = uVar18 & 0xffffffff;
              break;
            }
            *(undefined8 *)((long)workSpace + uVar18 * 8 + 8) =
                 *(undefined8 *)((long)workSpace + uVar25 * 8 + 8);
          }
          *(uint *)((long)workSpace + uVar19 * 8 + 8) = uVar26;
          *(char *)((long)workSpace + uVar19 * 8 + 0xe) = (char)uVar24;
        }
        uVar26 = maxSymbolValue - 1;
        do {
          uVar17 = uVar26;
          uVar26 = uVar17 - 1;
        } while (*(int *)((long)workSpace + (ulong)(uVar17 + 1) * 8 + 8) == 0);
        uVar13 = uVar17 + 0x100;
        lVar10 = (long)(int)(uVar17 + 1);
        *(int *)((long)workSpace + 0x808) =
             *(int *)((long)workSpace + lVar10 * 8) + *(int *)((long)workSpace + lVar10 * 8 + 8);
        *(undefined2 *)((long)workSpace + lVar10 * 8 + 4) = 0x100;
        *(undefined2 *)((long)workSpace + lVar10 * 8 + 0xc) = 0x100;
        uVar4 = uVar17 + 2;
        for (uVar24 = 0x101; uVar24 <= uVar13; uVar24 = uVar24 + 1) {
          *(undefined4 *)((long)workSpace + uVar24 * 8 + 8) = 0x40000000;
        }
        *(undefined4 *)workSpace = 0x80000000;
        uVar24 = 0x101;
        uVar22 = 0x100;
        while( true ) {
          uVar12 = (uint)(uVar24 & 0xffff);
          if (uVar13 < uVar12) break;
          uVar5 = *(uint *)((long)workSpace + (long)(int)uVar26 * 8 + 8);
          uVar6 = *(uint *)((long)workSpace + (long)(int)uVar22 * 8 + 8);
          uVar23 = (uVar22 + 1) - (uint)(uVar5 < uVar6);
          uVar7 = uVar22;
          if (uVar5 < uVar6) {
            uVar7 = uVar26;
          }
          uVar22 = (uint)(uVar5 < uVar6);
          uVar21 = uVar26 - uVar22;
          uVar5 = *(uint *)((long)workSpace + (long)(int)uVar21 * 8 + 8);
          uVar6 = *(uint *)((long)workSpace + (long)(int)uVar23 * 8 + 8);
          uVar26 = (uVar26 - uVar22) - (uint)(uVar5 < uVar6);
          uVar22 = (uVar23 + 1) - (uint)(uVar5 < uVar6);
          if (uVar6 <= uVar5) {
            uVar21 = uVar23;
          }
          *(int *)((long)workSpace + (uVar24 & 0xffff) * 8 + 8) =
               *(int *)((long)workSpace + (ulong)uVar21 * 8 + 8) +
               *(int *)((long)workSpace + (ulong)uVar7 * 8 + 8);
          *(short *)((long)workSpace + (ulong)uVar21 * 8 + 0xc) = (short)uVar24;
          *(short *)((long)workSpace + (ulong)uVar7 * 8 + 0xc) = (short)uVar24;
          uVar24 = (ulong)(uVar12 + 1);
        }
        *(undefined1 *)((long)workSpace + (ulong)uVar13 * 8 + 0xf) = 0;
        for (uVar24 = (ulong)(uVar17 + 0xff); 0xff < uVar24; uVar24 = uVar24 - 1) {
          *(char *)((long)workSpace + uVar24 * 8 + 0xf) =
               *(char *)((long)workSpace +
                        (ulong)*(ushort *)((long)workSpace + uVar24 * 8 + 0xc) * 8 + 0xf) + '\x01';
        }
        for (uVar24 = 0; uVar4 != uVar24; uVar24 = uVar24 + 1) {
          *(char *)((long)workSpace + uVar24 * 8 + 0xf) =
               *(char *)((long)workSpace +
                        (ulong)*(ushort *)((long)workSpace + uVar24 * 8 + 0xc) * 8 + 0xf) + '\x01';
        }
        bVar2 = *(byte *)((long)workSpace + (ulong)(uVar17 + 1) * 8 + 0xf);
        iVar9 = bVar2 - uVar16;
        uVar26 = (uint)bVar2;
        if (uVar16 <= bVar2 && iVar9 != 0) {
          bVar11 = (byte)iVar9;
          iVar9 = 0;
          bVar20 = bVar2;
          while (uVar24 = (ulong)uVar17, uVar16 < bVar20) {
            iVar9 = iVar9 + (1 << (bVar11 & 0x1f)) + (-1 << (bVar2 - bVar20 & 0x1f));
            *(char *)((long)workSpace + (ulong)(uVar17 + 1) * 8 + 0xf) = (char)uVar16;
            uVar17 = uVar17 - 1;
            bVar20 = *(byte *)((long)workSpace + uVar24 * 8 + 0xf);
          }
          uVar24 = (ulong)(uVar17 + 2);
          do {
            uVar24 = (ulong)((int)uVar24 - 1);
          } while (uVar16 == *(byte *)((long)workSpace + uVar24 * 8 + 0xf));
          nbPerRank[8] = 0xf0f0;
          nbPerRank[9] = 0xf0f0;
          nbPerRank[10] = 0xf0f0;
          nbPerRank[0xb] = 0xf0f0;
          nbPerRank[0xc] = 0xf0f0;
          nbPerRank[0] = 0xf0f0;
          nbPerRank[1] = 0xf0f0;
          nbPerRank[2] = 0xf0f0;
          nbPerRank[3] = 0xf0f0;
          nbPerRank[4] = 0xf0f0;
          nbPerRank[5] = 0xf0f0;
          nbPerRank[6] = 0xf0f0;
          nbPerRank[7] = 0xf0f0;
          uVar18 = uVar24;
          uVar26 = uVar16;
          while (iVar14 = (int)uVar18, -1 < iVar14) {
            bVar20 = *(byte *)((long)workSpace + uVar18 * 8 + 0xf);
            if (bVar20 < uVar26) {
              uVar26 = (uint)bVar20;
              *(int *)(nbPerRank + (ulong)(uVar16 - uVar26) * 2) = iVar14;
            }
            uVar18 = (ulong)(iVar14 - 1);
          }
          uVar17 = iVar9 >> (bVar11 & 0x1f);
          do {
            if ((int)uVar17 < 1) {
              uVar18 = (ulong)nbPerRank._0_8_ >> 0x20;
              do {
                uVar13 = (uint)uVar18;
                iVar9 = uVar13 + 0xf0f0f10;
                iVar14 = 0;
                uVar22 = uVar17;
                while( true ) {
                  uVar13 = uVar13 + 1;
                  uVar26 = uVar16;
                  if (-1 < (int)uVar22) goto LAB_0042402d;
                  uVar18 = uVar24;
                  if (iVar9 == iVar14) break;
                  pcVar1 = (char *)((long)workSpace + (ulong)uVar13 * 8 + 0xf);
                  *pcVar1 = *pcVar1 + -1;
                  uVar22 = uVar22 + 1;
                  iVar14 = iVar14 + -1;
                }
                do {
                  uVar24 = uVar18;
                  uVar18 = (ulong)((int)uVar24 - 1);
                } while (uVar16 == *(byte *)((long)workSpace + uVar24 * 8 + 0xf));
                uVar18 = (ulong)((int)uVar24 + 1);
                pcVar1 = (char *)((long)workSpace + uVar18 * 8 + 0xf);
                *pcVar1 = *pcVar1 + -1;
                uVar17 = (uVar17 - iVar14) + 1;
              } while( true );
            }
            uVar26 = 0x1f;
            if (uVar17 != 0) {
              for (; uVar17 >> uVar26 == 0; uVar26 = uVar26 - 1) {
              }
            }
            for (uVar18 = (ulong)((uVar26 ^ 0xffffffe0) + 0x21); 1 < uVar18; uVar18 = uVar18 - 1) {
              if (((ulong)*(uint *)(nbPerRank + uVar18 * 2) != 0xf0f0f0f0) &&
                 ((*(uint *)(nbPerRank + (ulong)((int)uVar18 - 1) * 2) == 0xf0f0f0f0 ||
                  (*(uint *)((long)workSpace + (ulong)*(uint *)(nbPerRank + uVar18 * 2) * 8 + 8) <=
                   (uint)(*(int *)((long)workSpace +
                                  (ulong)*(uint *)(nbPerRank + (ulong)((int)uVar18 - 1) * 2) * 8 + 8
                                  ) * 2))))) goto LAB_00423f5d;
            }
            uVar18 = 1;
LAB_00423f5d:
            uVar19 = uVar18 & 0xffffffff;
            uVar25 = uVar18 & 0xffffffff;
            if ((uint)uVar18 < 0xe) {
              uVar25 = 0xd;
            }
            for (; uVar26 = (uint)uVar25, uVar19 < 0xd; uVar19 = uVar19 + 1) {
              if (*(int *)(nbPerRank + uVar19 * 2) != -0xf0f0f10) {
                uVar26 = (uint)uVar19;
                break;
              }
            }
            uVar12 = uVar26 - 1;
            uVar13 = *(uint *)(nbPerRank + (ulong)uVar26 * 2);
            uVar22 = *(uint *)(nbPerRank + (ulong)uVar12 * 2);
            if (*(uint *)(nbPerRank + (ulong)uVar12 * 2) == 0xf0f0f0f0) {
              uVar22 = uVar13;
            }
            *(uint *)(nbPerRank + (ulong)uVar12 * 2) = uVar22;
            pcVar1 = (char *)((long)workSpace + (ulong)uVar13 * 8 + 0xf);
            *pcVar1 = *pcVar1 + '\x01';
            if ((ulong)uVar13 == 0) {
              uVar13 = 0xf0f0f0f0;
            }
            else {
              uVar13 = uVar13 - 1;
              if (uVar16 - uVar26 != (uint)*(byte *)((long)workSpace + (ulong)uVar13 * 8 + 0xf)) {
                uVar13 = 0xf0f0f0f0;
              }
            }
            uVar17 = uVar17 + (-1 << ((byte)uVar12 & 0x1f));
            *(uint *)(nbPerRank + (ulong)uVar26 * 2) = uVar13;
          } while( true );
        }
LAB_0042402d:
        nbPerRank[8] = 0;
        nbPerRank[9] = 0;
        nbPerRank[10] = 0;
        nbPerRank[0xb] = 0;
        nbPerRank[0xc] = 0;
        nbPerRank[0] = 0;
        nbPerRank[1] = 0;
        nbPerRank[2] = 0;
        nbPerRank[3] = 0;
        nbPerRank[4] = 0;
        nbPerRank[5] = 0;
        nbPerRank[6] = 0;
        nbPerRank[7] = 0;
        valPerRank[8] = 0;
        valPerRank[9] = 0;
        valPerRank[10] = 0;
        valPerRank[0xb] = 0;
        valPerRank[0xc] = 0;
        valPerRank[0] = 0;
        valPerRank[1] = 0;
        valPerRank[2] = 0;
        valPerRank[3] = 0;
        valPerRank[4] = 0;
        valPerRank[5] = 0;
        valPerRank[6] = 0;
        valPerRank[7] = 0;
        if (uVar26 < 0xd) {
          for (uVar24 = 0; uVar4 != uVar24; uVar24 = uVar24 + 1) {
            nbPerRank[*(byte *)((long)workSpace + uVar24 * 8 + 0xf)] =
                 nbPerRank[*(byte *)((long)workSpace + uVar24 * 8 + 0xf)] + 1;
          }
          uVar24 = (ulong)bVar2;
          if ((ulong)uVar16 < (ulong)bVar2) {
            uVar24 = (ulong)uVar16;
          }
          uVar8 = 0;
          while (uVar24 != 0) {
            valPerRank[uVar24] = uVar8;
            uVar8 = (ushort)(uVar8 + nbPerRank[uVar24]) >> 1;
            uVar24 = uVar24 - 1;
          }
          for (uVar24 = 0; uVar15 != uVar24; uVar24 = uVar24 + 1) {
            tree[*(byte *)((long)workSpace + uVar24 * 8 + 0xe)].nbBits =
                 *(BYTE *)((long)workSpace + uVar24 * 8 + 0xf);
          }
          for (uVar24 = 0; uVar15 != uVar24; uVar24 = uVar24 + 1) {
            UVar3 = valPerRank[tree[uVar24].nbBits];
            valPerRank[tree[uVar24].nbBits] = UVar3 + 1;
            tree[uVar24].val = UVar3;
          }
        }
        sStack_170 = 0xffffffffffffffff;
        if (uVar26 < 0xd) {
          sStack_170 = (ulong)uVar26;
        }
      }
      else {
        sStack_170 = 0xffffffffffffffd2;
      }
    }
  }
  else {
    sStack_170 = 0xffffffffffffffff;
  }
  return sStack_170;
}

Assistant:

size_t HUF_buildCTable_wksp (HUF_CElt* tree, const unsigned* count, U32 maxSymbolValue, U32 maxNbBits, void* workSpace, size_t wkspSize)
{
    nodeElt* const huffNode0 = (nodeElt*)workSpace;
    nodeElt* const huffNode = huffNode0+1;
    U32 n, nonNullRank;
    int lowS, lowN;
    U16 nodeNb = STARTNODE;
    U32 nodeRoot;

    /* safety checks */
    if (((size_t)workSpace & 3) != 0) return ERROR(GENERIC);  /* must be aligned on 4-bytes boundaries */
    if (wkspSize < sizeof(huffNodeTable)) return ERROR(workSpace_tooSmall);
    if (maxNbBits == 0) maxNbBits = HUF_TABLELOG_DEFAULT;
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX) return ERROR(maxSymbolValue_tooLarge);
    memset(huffNode0, 0, sizeof(huffNodeTable));

    /* sort, decreasing order */
    HUF_sort(huffNode, count, maxSymbolValue);

    /* init for parents */
    nonNullRank = maxSymbolValue;
    while(huffNode[nonNullRank].count == 0) nonNullRank--;
    lowS = nonNullRank; nodeRoot = nodeNb + lowS - 1; lowN = nodeNb;
    huffNode[nodeNb].count = huffNode[lowS].count + huffNode[lowS-1].count;
    huffNode[lowS].parent = huffNode[lowS-1].parent = nodeNb;
    nodeNb++; lowS-=2;
    for (n=nodeNb; n<=nodeRoot; n++) huffNode[n].count = (U32)(1U<<30);
    huffNode0[0].count = (U32)(1U<<31);  /* fake entry, strong barrier */

    /* create parents */
    while (nodeNb <= nodeRoot) {
        U32 n1 = (huffNode[lowS].count < huffNode[lowN].count) ? lowS-- : lowN++;
        U32 n2 = (huffNode[lowS].count < huffNode[lowN].count) ? lowS-- : lowN++;
        huffNode[nodeNb].count = huffNode[n1].count + huffNode[n2].count;
        huffNode[n1].parent = huffNode[n2].parent = nodeNb;
        nodeNb++;
    }

    /* distribute weights (unlimited tree height) */
    huffNode[nodeRoot].nbBits = 0;
    for (n=nodeRoot-1; n>=STARTNODE; n--)
        huffNode[n].nbBits = huffNode[ huffNode[n].parent ].nbBits + 1;
    for (n=0; n<=nonNullRank; n++)
        huffNode[n].nbBits = huffNode[ huffNode[n].parent ].nbBits + 1;

    /* enforce maxTableLog */
    maxNbBits = HUF_setMaxHeight(huffNode, nonNullRank, maxNbBits);

    /* fill result into tree (val, nbBits) */
    {   U16 nbPerRank[HUF_TABLELOG_MAX+1] = {0};
        U16 valPerRank[HUF_TABLELOG_MAX+1] = {0};
        if (maxNbBits > HUF_TABLELOG_MAX) return ERROR(GENERIC);   /* check fit into table */
        for (n=0; n<=nonNullRank; n++)
            nbPerRank[huffNode[n].nbBits]++;
        /* determine stating value per rank */
        {   U16 min = 0;
            for (n=maxNbBits; n>0; n--) {
                valPerRank[n] = min;      /* get starting value within each rank */
                min += nbPerRank[n];
                min >>= 1;
        }   }
        for (n=0; n<=maxSymbolValue; n++)
            tree[huffNode[n].byte].nbBits = huffNode[n].nbBits;   /* push nbBits per symbol, symbol order */
        for (n=0; n<=maxSymbolValue; n++)
            tree[n].val = valPerRank[tree[n].nbBits]++;   /* assign value within rank, symbol order */
    }

    return maxNbBits;
}